

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void __thiscall JsonArray_TooDeeplyNested_Test::TestBody(JsonArray_TooDeeplyNested_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  error_category *peVar2;
  parser<json_out_callbacks> *this_00;
  char *message;
  AssertionResult gtest_ar;
  parser<json_out_callbacks> p;
  AssertHelper local_150;
  error_category *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  long local_138 [2];
  long *local_128;
  error_category *local_120;
  json_out_callbacks local_118;
  result_type local_f0;
  parser<json_out_callbacks> local_d0;
  
  paVar1 = &local_118.out_.field_2;
  local_118.out_.field_2._8_8_ = 0;
  local_118.out_._M_string_length = 0;
  local_118.out_.field_2._M_allocated_capacity = 0;
  local_118.out_._M_dataplus._M_p = (pointer)paVar1;
  pstore::json::parser<json_out_callbacks>::parser(&local_d0,&local_118,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_118.out_._M_dataplus._M_p,local_118.out_.field_2._M_allocated_capacity + 1
                   );
  }
  local_148 = (error_category *)local_138;
  std::__cxx11::string::_M_construct((ulong)&local_148,-0x38);
  peVar2 = local_148;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_128,(index_type)local_140);
  local_120 = peVar2;
  this_00 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                      (&local_d0,(span<const_char,__1L> *)&local_128);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_f0,this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_148 != (error_category *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_120 = pstore::json::get_error_category();
  local_128 = (long *)CONCAT44(local_128._4_4_,0xe);
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_148,"p.last_error ()",
             "make_error_code (json::error_code::nesting_too_deep)",&local_d0.error_,
             (error_code *)&local_128);
  if (local_148._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_128);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0xff,message);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_128 != (long *)0x0) {
      (**(code **)(*local_128 + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.string_._M_dataplus._M_p != &local_d0.string_.field_2) {
    operator_delete(local_d0.string_._M_dataplus._M_p,
                    local_d0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.callbacks_.out_._M_dataplus._M_p != &local_d0.callbacks_.out_.field_2) {
    operator_delete(local_d0.callbacks_.out_._M_dataplus._M_p,
                    local_d0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_d0.stack_.c);
  if (local_d0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_d0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, TooDeeplyNested) {
    json::parser<json_out_callbacks> p;
    p.input (std::string (std::string::size_type{200}, '[')).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::nesting_too_deep));
}